

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void Test_Strerror_logging::RunTest(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *buf;
  string *psVar4;
  ostream *poVar5;
  int err;
  size_t size;
  CheckOpString local_58;
  string local_50;
  char *msg;
  
  pcVar2 = strerror(4);
  pcVar2 = strdup(pcVar2);
  msg = pcVar2;
  sVar3 = strlen(pcVar2);
  size = sVar3 + 1;
  buf = (char *)operator_new(size);
  iVar1 = google::posix_strerror_r(4,(char *)0x0,0);
  psVar4 = google::Check_EQImpl_abi_cxx11_(iVar1,-1,"posix_strerror_r(errcode, __null, 0) == -1");
  if (psVar4 == (string *)0x0) {
    *buf = 'A';
    iVar1 = google::posix_strerror_r(4,buf,0);
    psVar4 = google::Check_EQImpl_abi_cxx11_(iVar1,-1,"posix_strerror_r(errcode, buf, 0) == -1");
    if (psVar4 == (string *)0x0) {
      local_50._M_dataplus._M_p._0_1_ = *buf;
      local_58.str_._0_1_ = 0x41;
      psVar4 = google::Check_EQImpl<char,char>
                         ((char *)&local_50,(char *)&local_58,"buf[0] == \'A\'");
      if (psVar4 == (string *)0x0) {
        iVar1 = google::posix_strerror_r(4,(char *)0x0,size);
        psVar4 = google::Check_EQImpl_abi_cxx11_
                           (iVar1,-1,"posix_strerror_r(errcode, __null, buf_size) == -1");
        if (psVar4 == (string *)0x0) {
          iVar1 = google::posix_strerror_r(4,buf,1);
          psVar4 = google::Check_EQImpl_abi_cxx11_(iVar1,0,"posix_strerror_r(errcode, buf, 1) == 0")
          ;
          if (psVar4 == (string *)0x0) {
            psVar4 = google::CheckstrcmptrueImpl_abi_cxx11_(buf,"","buf == \"\"");
            if (psVar4 == (string *)0x0) {
              iVar1 = google::posix_strerror_r(4,buf,size);
              psVar4 = google::Check_EQImpl_abi_cxx11_
                                 (iVar1,0,"posix_strerror_r(errcode, buf, buf_size) == 0");
              if (psVar4 == (string *)0x0) {
                psVar4 = google::CheckstrcmptrueImpl_abi_cxx11_(buf,pcVar2,"buf == msg");
                if (psVar4 == (string *)0x0) {
                  free(buf);
                  google::StrError_abi_cxx11_(&local_50,(google *)0x4,err);
                  psVar4 = google::Check_EQImpl<char*,std::__cxx11::string>
                                     (&msg,&local_50,"msg == StrError(errcode)");
                  std::__cxx11::string::~string((string *)&local_50);
                  if (psVar4 == (string *)0x0) {
                    free(msg);
                    return;
                  }
                  local_58.str_ = psVar4;
                  google::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_50,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                             ,0x431,&local_58);
                  google::LogMessage::stream((LogMessage *)&local_50);
                }
                else {
                  google::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_50,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                             ,0x42f);
                  poVar5 = google::LogMessage::stream((LogMessage *)&local_50);
                  std::operator<<(poVar5,(string *)psVar4);
                }
              }
              else {
                local_58.str_ = psVar4;
                google::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_50,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                           ,0x42e,&local_58);
                google::LogMessage::stream((LogMessage *)&local_50);
              }
            }
            else {
              google::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                         ,0x42d);
              poVar5 = google::LogMessage::stream((LogMessage *)&local_50);
              std::operator<<(poVar5,(string *)psVar4);
            }
          }
          else {
            local_58.str_ = psVar4;
            google::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                       ,0x42b,&local_58);
            google::LogMessage::stream((LogMessage *)&local_50);
          }
        }
        else {
          local_58.str_ = psVar4;
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_50,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x425,&local_58);
          google::LogMessage::stream((LogMessage *)&local_50);
        }
      }
      else {
        local_58.str_ = psVar4;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x424,&local_58);
        google::LogMessage::stream((LogMessage *)&local_50);
      }
    }
    else {
      local_58.str_ = psVar4;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x423,&local_58);
      google::LogMessage::stream((LogMessage *)&local_50);
    }
  }
  else {
    local_58.str_ = psVar4;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x421,&local_58);
    google::LogMessage::stream((LogMessage *)&local_50);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

TEST(Strerror, logging) {
  int errcode = EINTR;
  char *msg = strdup(strerror(errcode));
  const size_t buf_size = strlen(msg) + 1;
  char *buf = new char[buf_size];
  CHECK_EQ(posix_strerror_r(errcode, NULL, 0), -1);
  buf[0] = 'A';
  CHECK_EQ(posix_strerror_r(errcode, buf, 0), -1);
  CHECK_EQ(buf[0], 'A');
  CHECK_EQ(posix_strerror_r(errcode, NULL, buf_size), -1);
#if defined(OS_MACOSX) || defined(OS_FREEBSD) || defined(OS_OPENBSD)
  // MacOSX or FreeBSD considers this case is an error since there is
  // no enough space.
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), -1);
#else
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), 0);
#endif
  CHECK_STREQ(buf, "");
  CHECK_EQ(posix_strerror_r(errcode, buf, buf_size), 0);
  CHECK_STREQ(buf, msg);
  delete[] buf;
  CHECK_EQ(msg, StrError(errcode));
  free(msg);
}